

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect.c
# Opt level: O2

int mj_effect_grayscale(mj_jpeg_t *m)

{
  undefined8 *puVar1;
  uint uVar2;
  jpeg_component_info *pjVar3;
  JBLOCKROW paJVar4;
  JBLOCKARRAY ppaJVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  
  iVar7 = 2;
  if (((m != (mj_jpeg_t *)0x0) && (m->coef != (jvirt_barray_ptr *)0x0)) &&
     (iVar7 = 0, (m->cinfo).jpeg_color_space == JCS_YCbCr)) {
    iVar7 = 0;
    for (lVar10 = 1; lVar10 < (m->cinfo).num_components; lVar10 = lVar10 + 1) {
      pjVar3 = (m->cinfo).comp_info;
      for (uVar11 = 0; uVar11 < pjVar3[lVar10].height_in_blocks; uVar11 = uVar11 + 1) {
        ppaJVar5 = (*((m->cinfo).mem)->access_virt_barray)
                             ((j_common_ptr)m,m->coef[lVar10],uVar11,1,1);
        uVar2 = pjVar3[lVar10].width_in_blocks;
        lVar6 = 0;
        for (uVar8 = 0; uVar8 != uVar2; uVar8 = uVar8 + 1) {
          paJVar4 = *ppaJVar5;
          for (uVar9 = 0; uVar9 < 0x40; uVar9 = uVar9 + 8) {
            puVar1 = (undefined8 *)((long)*paJVar4 + uVar9 * 2 + lVar6);
            *puVar1 = 0;
            puVar1[1] = 0;
          }
          lVar6 = lVar6 + 0x80;
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int mj_effect_grayscale(mj_jpeg_t *m) {
    int                  i, c;
    JDIMENSION           k, l;
    jpeg_component_info *component;
    JBLOCKARRAY          blocks;
    JCOEFPTR             coefs;

    if(m == NULL || m->coef == NULL) {
        return MJ_ERR_NULL_DATA;
    }

    if(m->cinfo.jpeg_color_space != JCS_YCbCr) {
        return MJ_OK;
    }

    /* set all color components to 0 */
    for(c = 1; c < m->cinfo.num_components; c++) {
        component = &m->cinfo.comp_info[c];

        for(l = 0; l < component->height_in_blocks; l++) {
            blocks = (*m->cinfo.mem->access_virt_barray)((j_common_ptr)&m->cinfo, m->coef[c], l, 1, TRUE);

            for(k = 0; k < component->width_in_blocks; k++) {
                coefs = blocks[0][k];

                for(i = 0; i < DCTSIZE2; i += 8) {
                    coefs[i + 0] = 0;
                    coefs[i + 1] = 0;
                    coefs[i + 2] = 0;
                    coefs[i + 3] = 0;
                    coefs[i + 4] = 0;
                    coefs[i + 5] = 0;
                    coefs[i + 6] = 0;
                    coefs[i + 7] = 0;
                }
            }
        }
    }

    return MJ_OK;
}